

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCombinedCase::runComputeShader
          (ComputeShaderGeneratedCombinedCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  DrawMethod DVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  IVec3 *v;
  uint uVar10;
  IVec3 nullSize;
  IVec3 dispatchSize;
  IVec3 indexBufferDispatchSize;
  IVec3 drawArraysDataBufferDispatchSize;
  IVec3 drawElementsDataBufferDispatchSize;
  string local_1e0 [32];
  IVec3 commandDispatchSize;
  IVec3 dataBufferDispatchSize;
  undefined1 local_1a8 [384];
  long lVar9;
  
  iVar7 = (*((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  DVar4 = (this->super_ComputeShaderGeneratedCase).m_drawMethod;
  nullSize.m_data[0] = 0;
  nullSize.m_data[1] = 0;
  nullSize.m_data[2] = 0;
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    commandDispatchSize.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
    commandDispatchSize.m_data._4_8_ = &DAT_100000001;
  }
  else {
    tcu::Vector<int,_3>::Vector(&commandDispatchSize,&nullSize);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    drawElementsDataBufferDispatchSize.m_data[0] =
         (this->super_ComputeShaderGeneratedCase).m_gridSize + 1;
    drawElementsDataBufferDispatchSize.m_data[2] = 1;
    bVar6 = 1;
    drawElementsDataBufferDispatchSize.m_data[1] = drawElementsDataBufferDispatchSize.m_data[0];
  }
  else {
    tcu::Vector<int,_3>::Vector(&drawElementsDataBufferDispatchSize,&nullSize);
    bVar6 = (this->super_ComputeShaderGeneratedCase).m_computeData;
  }
  if ((bVar6 & 1) == 0) {
    tcu::Vector<int,_3>::Vector(&drawArraysDataBufferDispatchSize,&nullSize);
  }
  else {
    drawArraysDataBufferDispatchSize.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_gridSize
    ;
    drawArraysDataBufferDispatchSize.m_data[2] = 1;
    drawArraysDataBufferDispatchSize.m_data[1] = drawArraysDataBufferDispatchSize.m_data[0];
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) &&
     (DVar4 == DRAWMETHOD_DRAWELEMENTS)) {
    indexBufferDispatchSize.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    indexBufferDispatchSize.m_data[2] = 1;
    indexBufferDispatchSize.m_data[1] = indexBufferDispatchSize.m_data[0];
  }
  else {
    tcu::Vector<int,_3>::Vector(&indexBufferDispatchSize,&nullSize);
  }
  v = &drawArraysDataBufferDispatchSize;
  if ((this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    v = &drawElementsDataBufferDispatchSize;
  }
  tcu::Vector<int,_3>::Vector(&dataBufferDispatchSize,v);
  tcu::max<int,3>((tcu *)local_1a8,&commandDispatchSize,&dataBufferDispatchSize);
  tcu::max<int,3>((tcu *)&dispatchSize,(Vector<int,_3> *)local_1a8,&indexBufferDispatchSize);
  (**(code **)(lVar9 + 0x1680))((this->m_computeProgram->m_program).m_program);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"use compute shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x665);
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    iVar7 = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
    iVar5 = (this->super_ComputeShaderGeneratedCase).m_commandSize;
    local_1a8._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Binding command buffer to binding point ");
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar9 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_cmdBufferID);
    local_1a8._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Allocating memory for command buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_(0);
    std::operator<<((ostream *)poVar1,local_1e0);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar9 + 0x150))(0x90d2,(long)(iVar7 * iVar5),0,0x88e8);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    bVar2 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
    dVar8 = ComputeShaderGeneratedCase::calcDrawBufferSize(&this->super_ComputeShaderGeneratedCase);
    local_1a8._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Binding data buffer to binding point ");
    std::ostream::operator<<(poVar1,(uint)bVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar9 + 0x48))
              (0x90d2,bVar2,(this->super_ComputeShaderGeneratedCase).m_dataBufferID);
    local_1a8._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Allocating memory for data buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_(0);
    std::operator<<((ostream *)poVar1,local_1e0);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar9 + 0x150))(0x90d2,(long)(int)(dVar8 << 4),0,0x88e8);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) {
    bVar2 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
    bVar3 = (this->super_ComputeShaderGeneratedCase).m_computeData;
    uVar10 = (uint)bVar3;
    if ((bVar2 == true) && ((bVar3 & 1U) != 0)) {
      uVar10 = 2;
    }
    else if (bVar2 != false) {
      uVar10 = 1;
    }
    iVar7 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    iVar5 = 0;
    if ((this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      iVar5 = iVar7 * iVar7 * 0x18;
    }
    local_1a8._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Binding index buffer to binding point ");
    std::ostream::operator<<(poVar1,uVar10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar9 + 0x48))
              (0x90d2,uVar10,(this->super_ComputeShaderGeneratedCase).m_indexBufferID);
    local_1a8._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Allocating memory for index buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_(0);
    std::operator<<((ostream *)poVar1,local_1e0);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar9 + 0x150))(0x90d2,(long)iVar5,0,0x88e8);
  }
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"setup buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x68d);
  local_1a8._0_8_ =
       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Dispatching compute, size = ");
  tcu::operator<<((ostream *)poVar1,&dispatchSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar9 + 0x528))(dispatchSize.m_data[0],dispatchSize.m_data[1],dispatchSize.m_data[2])
  ;
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"calculate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x694);
  return;
}

Assistant:

void ComputeShaderGeneratedCombinedCase::runComputeShader (void)
{
	const glw::Functions&	gl									= m_context.getRenderContext().getFunctions();
	const bool				indexed								= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS);
	const tcu::IVec3		nullSize							(0, 0, 0);
	const tcu::IVec3		commandDispatchSize					= (m_computeCmd)				? (tcu::IVec3(m_numDrawCmds, 1, 1))				: (nullSize);
	const tcu::IVec3		drawElementsDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize+1, m_gridSize+1, 1))	: (nullSize);
	const tcu::IVec3		drawArraysDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);
	const tcu::IVec3		indexBufferDispatchSize				= (m_computeIndices && indexed)	? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);

	const tcu::IVec3		dataBufferDispatchSize				= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS) ? (drawElementsDataBufferDispatchSize) : (drawArraysDataBufferDispatchSize);
	const tcu::IVec3		dispatchSize						= tcu::max(tcu::max(commandDispatchSize, dataBufferDispatchSize), indexBufferDispatchSize);

	gl.useProgram(m_computeProgram->getProgram());
	glu::checkError(gl.getError(), "use compute shader", __FILE__, __LINE__);

	// setup buffers

	if (m_computeCmd)
	{
		const int			bindingPoint	= 0;
		const int			bufferSize		= m_commandSize * m_numDrawCmds;

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding command buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_cmdBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for command buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeData)
	{
		const int			bindingPoint	= (m_computeCmd) ? (1) : (0);
		const int			bufferSize		= (int)(calcDrawBufferSize()*sizeof(tcu::Vec4));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding data buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_dataBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for data buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeIndices)
	{
		const int			bindingPoint	= (m_computeCmd && m_computeData) ? (2) : (m_computeCmd || m_computeData) ? (1) : (0);
		const int			bufferSize		= (int)(calcIndexBufferSize()*sizeof(deUint32));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding index buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_indexBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for index buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	glu::checkError(gl.getError(), "setup buffers", __FILE__, __LINE__);

	// calculate

	m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching compute, size = " << dispatchSize << tcu::TestLog::EndMessage;
	gl.dispatchCompute(dispatchSize.x(), dispatchSize.y(), dispatchSize.z());

	glu::checkError(gl.getError(), "calculate", __FILE__, __LINE__);
}